

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O2

void __thiscall
ut11::
Mock<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>)>
::operator()(Mock<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>)>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
            function<void_()> *args_1)

{
  function<void_()> fStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->m_callbackHandler).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::function<void_()>_&)>
    ::operator()(&this->m_callbackHandler,args,args_1);
  }
  std::__cxx11::string::string((string *)&local_38,(string *)args);
  std::function<void_()>::function(&fStack_58,args_1);
  detail::
  MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::AddCall(&this->m_argumentHandler,&local_38,&fStack_58);
  std::_Function_base::~_Function_base(&fStack_58.super__Function_base);
  std::__cxx11::string::~string((string *)&local_38);
  detail::
  MockReturnHandler<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::operator()(&this->m_returnHandler,args,args_1);
  return;
}

Assistant:

R operator()(ARGS... args)
		{
			if ( m_callbackHandler )
				m_callbackHandler(args...);

			m_argumentHandler.AddCall(args...);
			return m_returnHandler(args...);
		}